

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O2

void __thiscall
google::protobuf::DescriptorBuilder::
ValidateNamingStyle<google::protobuf::EnumValueDescriptor,google::protobuf::EnumValueDescriptorProto>
          (DescriptorBuilder *this,EnumValueDescriptor *enum_value,EnumValueDescriptorProto *proto)

{
  byte *pbVar1;
  anon_unknown_24 *this_00;
  char *pcVar2;
  FunctionRef<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
  make_error;
  bool bVar3;
  anon_unknown_24 *paVar4;
  string_view name;
  string_view element_name;
  string error;
  EnumValueDescriptor *local_68;
  VoidPtr local_60;
  code *pcStack_58;
  LogMessageFatal local_50;
  undefined1 *local_40;
  undefined8 local_38;
  undefined1 local_30 [16];
  
  local_40 = local_30;
  local_38 = 0;
  local_30[0] = 0;
  this_00 = (anon_unknown_24 *)enum_value->all_names_->_M_string_length;
  local_68 = enum_value;
  if (this_00 == (anon_unknown_24 *)0x0) {
    absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
              (&local_50,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.cc"
               ,0x23fa,"!name.empty()");
    absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal(&local_50);
  }
  pcVar2 = (enum_value->all_names_->_M_dataplus)._M_p;
  paVar4 = (anon_unknown_24 *)0x0;
  do {
    if (this_00 == paVar4) {
      if (((byte)(*pcVar2 + 0xbfU) < 0x1a) &&
         (name._M_str = "", name._M_len = (size_t)pcVar2,
         bVar3 = anon_unknown_24::ContainsBadUnderscores(this_00,name), !bVar3)) goto LAB_002e110b;
      break;
    }
    pbVar1 = (byte *)(pcVar2 + (long)paVar4);
    paVar4 = paVar4 + 1;
  } while ((*(ulong *)(&DAT_005cd100 + (ulong)(*pbVar1 >> 6) * 8) >> ((ulong)*pbVar1 & 0x3f) & 1) !=
           0);
  std::__cxx11::string::assign((char *)&local_40);
  local_50.super_LogMessage._0_8_ = &local_68;
  local_60.obj = &local_50;
  pcStack_58 = absl::lts_20250127::functional_internal::
               InvokeObject<google::protobuf::DescriptorBuilder::ValidateNamingStyle<google::protobuf::EnumValueDescriptor,google::protobuf::EnumValueDescriptorProto>(google::protobuf::EnumValueDescriptor_const*,google::protobuf::EnumValueDescriptorProto_const&)::__0,std::__cxx11::string>
  ;
  make_error.invoker_ =
       absl::lts_20250127::functional_internal::
       InvokeObject<google::protobuf::DescriptorBuilder::ValidateNamingStyle<google::protobuf::EnumValueDescriptor,google::protobuf::EnumValueDescriptorProto>(google::protobuf::EnumValueDescriptor_const*,google::protobuf::EnumValueDescriptorProto_const&)::__0,std::__cxx11::string>
  ;
  make_error.ptr_.obj = local_60.obj;
  element_name._M_str = (enum_value->all_names_->_M_dataplus)._M_p;
  element_name._M_len = enum_value->all_names_->_M_string_length;
  local_50.super_LogMessage.data_._M_t.
  super___uniq_ptr_impl<absl::lts_20250127::log_internal::LogMessage::LogMessageData,_std::default_delete<absl::lts_20250127::log_internal::LogMessage::LogMessageData>_>
  ._M_t.
  super__Tuple_impl<0UL,_absl::lts_20250127::log_internal::LogMessage::LogMessageData_*,_std::default_delete<absl::lts_20250127::log_internal::LogMessage::LogMessageData>_>
  .super__Head_base<0UL,_absl::lts_20250127::log_internal::LogMessage::LogMessageData_*,_false>.
  _M_head_impl = (__uniq_ptr_data<absl::lts_20250127::log_internal::LogMessage::LogMessageData,_std::default_delete<absl::lts_20250127::log_internal::LogMessage::LogMessageData>,_true,_true>
                  )(__uniq_ptr_data<absl::lts_20250127::log_internal::LogMessage::LogMessageData,_std::default_delete<absl::lts_20250127::log_internal::LogMessage::LogMessageData>,_true,_true>
                    )&local_40;
  AddError(this,element_name,&proto->super_Message,NAME,make_error);
LAB_002e110b:
  std::__cxx11::string::~string((string *)&local_40);
  return;
}

Assistant:

void DescriptorBuilder::ValidateNamingStyle(
    const EnumValueDescriptor* enum_value,
    const EnumValueDescriptorProto& proto) {
  std::string error;
  if (!IsValidUpperSnakeCaseName(enum_value->name(), &error)) {
    AddError(enum_value->name(), proto, DescriptorPool::ErrorCollector::NAME,
             [&] {
               return absl::StrCat("Enum value name ", enum_value->name(), " ",
                                   error, kNamingStyleOptOutMessage);
             });
  }
}